

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

opj_bool dwt_decode_v2(opj_tcd_tilecomp_v2_t *tilec,OPJ_UINT32 numres)

{
  opj_tcd_resolution_v2_t *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  OPJ_INT32 *pOVar6;
  OPJ_UINT32 OVar7;
  uint uVar8;
  opj_bool oVar9;
  int *__ptr;
  ulong uVar10;
  opj_tcd_resolution_v2_t *r;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int x;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  dwt_t h;
  dwt_t v;
  
  r = tilec->resolutions;
  iVar2 = r->x1;
  iVar3 = r->x0;
  iVar4 = r->y0;
  iVar5 = r->y1;
  x = tilec->x1 - tilec->x0;
  OVar7 = dwt_max_resolution_v2(r,numres);
  __ptr = (int *)malloc((ulong)OVar7 << 2);
  if (__ptr == (int *)0x0) {
    oVar9 = 0;
  }
  else {
    uVar16 = iVar5 - iVar4;
    uVar12 = iVar2 - iVar3;
    h.mem = __ptr;
    v.mem = __ptr;
    while (numres = numres - 1, numres != 0) {
      pOVar6 = tilec->data;
      poVar1 = r + 1;
      uVar15 = r[1].y1 - r[1].y0;
      uVar14 = r[1].x1 - r[1].x0;
      h.dn = uVar14 - uVar12;
      h.cas = r[1].x0 % 2;
      uVar8 = 0;
      uVar13 = (ulong)uVar15;
      h.sn = uVar12;
      v.sn = uVar16;
      while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
        dwt_interleave_h(&h,pOVar6 + uVar8);
        dwt_decode_1(&h);
        memcpy(pOVar6 + uVar8,__ptr,(ulong)uVar14 * 4);
        uVar8 = uVar8 + x;
      }
      v.dn = uVar15 - uVar16;
      v.cas = r[1].y0 % 2;
      for (uVar13 = 0; r = poVar1, uVar16 = uVar15, uVar12 = uVar14, uVar13 != uVar14;
          uVar13 = uVar13 + 1) {
        dwt_interleave_v(&v,pOVar6 + uVar13,x);
        dwt_decode_1(&v);
        uVar10 = uVar13 & 0xffffffff;
        for (uVar11 = 0; uVar15 != uVar11; uVar11 = uVar11 + 1) {
          pOVar6[uVar10] = __ptr[uVar11];
          uVar10 = (ulong)(uint)((int)uVar10 + x);
        }
      }
    }
    free(__ptr);
    oVar9 = 1;
  }
  return oVar9;
}

Assistant:

opj_bool dwt_decode_v2(opj_tcd_tilecomp_v2_t* tilec, OPJ_UINT32 numres) {
	return dwt_decode_tile_v2(tilec, numres, &dwt_decode_1);
}